

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O0

void ChopUpSingleUncompressedStrip(TIFF *tif)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint64_t uVar3;
  toff_t tVar4;
  uint local_50;
  uint local_48;
  uint32_t rowblocksperstrip;
  uint32_t rowsperstrip;
  uint32_t nstrips;
  uint64_t stripbytes;
  uint64_t rowblockbytes;
  uint32_t rowblock;
  uint64_t offset;
  uint64_t bytecount;
  TIFFDirectory *td;
  TIFF *tif_local;
  
  uVar3 = TIFFGetStrileByteCount(tif,0);
  if ((uVar3 != 0) || (tif->tif_mode == 0)) {
    uVar3 = TIFFGetStrileByteCount(tif,0);
    if ((tif->tif_dir).td_planarconfig != 1) {
      __assert_fail("td->td_planarconfig == PLANARCONFIG_CONTIG",
                    "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                    ,0x1caa,"void ChopUpSingleUncompressedStrip(TIFF *)");
    }
    if (((tif->tif_dir).td_photometric == 6) && ((tif->tif_flags & 0x4000) == 0)) {
      rowblockbytes._4_4_ = (uint)(tif->tif_dir).td_ycbcrsubsampling[1];
    }
    else {
      rowblockbytes._4_4_ = 1;
    }
    _rowsperstrip = TIFFVTileSize64(tif,rowblockbytes._4_4_);
    if (_rowsperstrip < 0x2001) {
      if (_rowsperstrip == 0) {
        return;
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = _rowsperstrip;
      uVar2 = SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x2000)) / auVar1,0);
      local_48 = uVar2 * rowblockbytes._4_4_;
      _rowsperstrip = uVar2 * _rowsperstrip;
    }
    else {
      local_48 = rowblockbytes._4_4_;
    }
    if (local_48 < (tif->tif_dir).td_rowsperstrip) {
      if ((tif->tif_dir).td_imagelength < -(local_48 - 1) - 1) {
        local_50 = ((tif->tif_dir).td_imagelength + (local_48 - 1)) / local_48;
      }
      else {
        local_50 = 0;
      }
      if ((local_50 != 0) &&
         (((tif->tif_mode != 0 || (local_50 < 0xf4241)) ||
          ((tVar4 = (*tif->tif_sizeproc)(tif->tif_clientdata), uVar3 < tVar4 &&
           (tVar4 = (*tif->tif_sizeproc)(tif->tif_clientdata),
           _rowsperstrip <= (tVar4 - uVar3) / (ulong)(local_50 - 1))))))) {
        allocChoppedUpStripArrays(tif,local_50,_rowsperstrip,local_48);
      }
    }
  }
  return;
}

Assistant:

static void ChopUpSingleUncompressedStrip(TIFF *tif)
{
    register TIFFDirectory *td = &tif->tif_dir;
    uint64_t bytecount;
    uint64_t offset;
    uint32_t rowblock;
    uint64_t rowblockbytes;
    uint64_t stripbytes;
    uint32_t nstrips;
    uint32_t rowsperstrip;

    bytecount = TIFFGetStrileByteCount(tif, 0);
    /* On a newly created file, just re-opened to be filled, we */
    /* don't want strip chop to trigger as it is going to cause issues */
    /* later ( StripOffsets and StripByteCounts improperly filled) . */
    if (bytecount == 0 && tif->tif_mode != O_RDONLY)
        return;
    offset = TIFFGetStrileByteCount(tif, 0);
    assert(td->td_planarconfig == PLANARCONFIG_CONTIG);
    if ((td->td_photometric == PHOTOMETRIC_YCBCR) && (!isUpSampled(tif)))
        rowblock = td->td_ycbcrsubsampling[1];
    else
        rowblock = 1;
    rowblockbytes = TIFFVTileSize64(tif, rowblock);
    /*
     * Make the rows hold at least one scanline, but fill specified amount
     * of data if possible.
     */
    if (rowblockbytes > STRIP_SIZE_DEFAULT)
    {
        stripbytes = rowblockbytes;
        rowsperstrip = rowblock;
    }
    else if (rowblockbytes > 0)
    {
        uint32_t rowblocksperstrip;
        rowblocksperstrip = (uint32_t)(STRIP_SIZE_DEFAULT / rowblockbytes);
        rowsperstrip = rowblocksperstrip * rowblock;
        stripbytes = rowblocksperstrip * rowblockbytes;
    }
    else
        return;

    /*
     * never increase the number of rows per strip
     */
    if (rowsperstrip >= td->td_rowsperstrip)
        return;
    nstrips = TIFFhowmany_32(td->td_imagelength, rowsperstrip);
    if (nstrips == 0)
        return;

    /* If we are going to allocate a lot of memory, make sure that the */
    /* file is as big as needed */
    if (tif->tif_mode == O_RDONLY && nstrips > 1000000 &&
        (offset >= TIFFGetFileSize(tif) ||
         stripbytes > (TIFFGetFileSize(tif) - offset) / (nstrips - 1)))
    {
        return;
    }

    allocChoppedUpStripArrays(tif, nstrips, stripbytes, rowsperstrip);
}